

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool LargeIntRegMultiply<unsigned_long,_int>::RegMultiply(uint64_t *a,int32_t b,uint64_t *pRet)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((b < 0) && (*a != 0)) {
    return false;
  }
  uVar2 = *a;
  if (uVar2 >> 0x20 == 0) {
    *pRet = uVar2 * (uint)b;
    return true;
  }
  uVar1 = (uVar2 >> 0x20) * (ulong)(uint)b;
  *pRet = uVar1;
  if (uVar1 >> 0x20 == 0) {
    uVar3 = (uVar2 & 0xffffffff) * (ulong)(uint)b;
    uVar2 = (uVar1 << 0x20) + uVar3;
    *pRet = uVar2;
    return uVar3 <= uVar2;
  }
  return false;
}

Assistant:

static bool RegMultiply( const std::uint64_t& a, std::int32_t b, std::uint64_t* pRet ) SAFEINT_NOTHROW
    {
        if( b < 0 && a != 0 )
            return false;

#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        return MultiplyUint64( a, (std::uint64_t)b, pRet );
#else
        return LargeIntRegMultiply< std::uint64_t, std::uint32_t >::RegMultiply(a, (std::uint32_t)b, pRet);
#endif
    }